

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JacobiSVD.h
# Opt level: O0

JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> * __thiscall
Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::compute
          (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *this,MatrixType *matrix,
          uint computationOptions)

{
  bool bVar1;
  bool bVar2;
  Index rows;
  Index cols;
  float *pfVar3;
  Scalar *x;
  Scalar *pSVar4;
  Scalar *__b;
  undefined1 *puVar5;
  Real RVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  Scalar extraout_XMM0_Da_01;
  ColXpr local_348;
  ColXpr local_318;
  ColXpr local_2e8;
  ColXpr local_2b8;
  Type local_288;
  Scalar local_24c;
  long lStack_248;
  RealScalar maxRemainingSingularValue;
  Index pos;
  Index i_1;
  ColXpr local_208;
  NegativeReturnType local_1d8;
  type local_19c;
  long lStack_198;
  RealScalar a;
  Index i;
  float local_188;
  float local_184;
  JacobiRotation<float> local_180;
  JacobiRotation<float> local_178;
  JacobiRotation<float> j_right;
  JacobiRotation<float> j_left;
  long lStack_160;
  RealScalar threshold;
  Index q;
  Index p;
  undefined1 local_148 [7];
  bool finished;
  ConstDiagonalReturnType local_138;
  Scalar local_11c;
  undefined1 local_118 [4];
  RealScalar maxDiagEntry;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>
  local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
  local_88;
  CwiseAbsReturnType local_70;
  float local_60;
  float local_5c;
  RealScalar scale;
  RealScalar considerAsZero;
  RealScalar precision;
  uint computationOptions_local;
  MatrixType *matrix_local;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *this_local;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  JacobiRotation<float> *local_18;
  float *local_10;
  
  considerAsZero = (RealScalar)computationOptions;
  _precision = (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)matrix;
  matrix_local = (MatrixType *)this;
  rows = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::rows
                   (&matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>);
  cols = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cols
                   ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)_precision);
  allocate(this,rows,cols,(uint)considerAsZero);
  RVar6 = GenericNumTraits<float>::epsilon();
  scale = RVar6 * 2.0;
  local_5c = std::numeric_limits<float>::min();
  MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cwiseAbs(&local_70,_precision);
  local_60 = DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
             ::maxCoeff<1>((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                            *)&local_70);
  bVar1 = numext::isfinite<float>(&local_60);
  if (bVar1) {
    if ((local_60 == 0.0) && (!NAN(local_60))) {
      local_60 = 1.0;
    }
    if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_rows ==
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_cols) {
      DenseBase<Eigen::Matrix<float,3,3,0,3,3>>::block<long,long>
                ((Type *)local_118,(DenseBase<Eigen::Matrix<float,3,3,0,3,3>> *)_precision,0,0,
                 (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_diagSize,
                 (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_diagSize);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>const,-1,-1,false>>::operator/
                (&local_e0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>const,_1,_1,false>> *)
                 local_118,&local_60);
      Matrix<float,3,3,0,3,3>::operator=
                ((Matrix<float,3,3,0,3,3> *)
                 &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  field_0x8c,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,__1,__1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,_3,_3>_>_>_>
                  *)&local_e0);
      if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
           m_computeFullU & 1U) != 0) {
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,
                   (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_rows,(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          m_rows);
      }
      if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
           m_computeThinU & 1U) != 0) {
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,
                   (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_rows,(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          m_diagSize);
      }
      if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
           m_computeFullV & 1U) != 0) {
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                   &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                    .m_matrixV,
                   (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_cols,(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          m_cols);
      }
      if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
           m_computeThinV & 1U) != 0) {
        MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
                  ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                   &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                    .m_matrixV,
                   (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_cols,(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          m_diagSize);
      }
    }
    else {
      MatrixBase<Eigen::Matrix<float,3,3,0,3,3>>::operator/
                (&local_88,(MatrixBase<Eigen::Matrix<float,3,3,0,3,3>> *)_precision,&local_60);
      Matrix<float,3,3,0,3,3>::operator=
                ((Matrix<float,3,3,0,3,3> *)&this->m_scaledMatrix,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>_>
                  *)&local_88);
      internal::qr_preconditioner_impl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_0,_false>::run
                ((qr_preconditioner_impl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_0,_false> *)
                 &this->field_0xb0,this,&this->m_scaledMatrix);
      internal::qr_preconditioner_impl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_1,_false>::run
                ((qr_preconditioner_impl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_1,_false> *)
                 &this->field_0xb1,this,&this->m_scaledMatrix);
    }
    MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cwiseAbs
              ((CwiseAbsReturnType *)local_148,
               (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
               &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                field_0x8c);
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
    ::diagonal(&local_138,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                *)local_148);
    local_11c = DenseBase<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
                ::maxCoeff((DenseBase<Eigen::Diagonal<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
                            *)&local_138);
    bVar1 = false;
    while (!bVar1) {
      bVar1 = true;
      for (q = 1; q < (this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      m_diagSize; q = q + 1) {
        for (lStack_160 = 0; lStack_160 < q; lStack_160 = lStack_160 + 1) {
          j_left.m_c = local_11c * 2.3841858e-07;
          local_10 = &local_5c;
          local_18 = &j_left;
          pfVar3 = std::max<float>(local_10,&local_18->m_c);
          j_left.m_s = *pfVar3;
          puVar5 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                    .field_0x8c;
          PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                    ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)puVar5,q,lStack_160);
          std::abs((int)puVar5);
          if (j_left.m_s < extraout_XMM0_Da) {
LAB_001eeddd:
            bVar1 = false;
            bVar2 = internal::
                    svd_precondition_2x2_block_to_be_real<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0,_false>
                    ::run((WorkMatrixType *)
                          &(this->
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                           .field_0x8c,this,q,lStack_160,&local_11c);
            if (bVar2) {
              JacobiRotation<float>::JacobiRotation(&j_right);
              JacobiRotation<float>::JacobiRotation(&local_178);
              internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
                        ((Matrix<float,_3,_3,_0,_3,_3> *)
                         &(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          field_0x8c,q,lStack_160,&j_right,&local_178);
              MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheLeft<float>
                        ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                         &(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          field_0x8c,q,lStack_160,&j_right);
              bVar2 = SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::computeU
                                (&this->
                                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                                );
              if (bVar2) {
                local_180 = JacobiRotation<float>::transpose(&j_right);
                MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheRight<float>
                          ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,q,lStack_160,
                           &local_180);
              }
              MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheRight<float>
                        ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                         &(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          field_0x8c,q,lStack_160,&local_178);
              bVar2 = SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::computeV
                                (&this->
                                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                                );
              if (bVar2) {
                MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::applyOnTheRight<float>
                          ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                           &(this->
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                            ).m_matrixV,q,lStack_160,&local_178);
              }
              puVar5 = &(this->
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                        field_0x8c;
              PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                        ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)puVar5,q,q);
              std::abs((int)puVar5);
              puVar5 = &(this->
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                        field_0x8c;
              PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                        ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)puVar5,lStack_160,
                         lStack_160);
              std::abs((int)puVar5);
              local_20 = &local_188;
              local_28 = (float *)((long)&i + 4);
              pfVar3 = std::max<float>(local_20,local_28);
              local_184 = *pfVar3;
              local_30 = &local_11c;
              local_38 = &local_184;
              pfVar3 = std::max<float>(local_30,local_38);
              local_11c = *pfVar3;
            }
          }
          else {
            puVar5 = &(this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      field_0x8c;
            PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                      ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)puVar5,lStack_160,q)
            ;
            std::abs((int)puVar5);
            if (j_left.m_s < extraout_XMM0_Da_00) goto LAB_001eeddd;
          }
        }
      }
    }
    for (lStack_198 = 0;
        lStack_198 <
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_diagSize;
        lStack_198 = lStack_198 + 1) {
      x = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                    ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     &(this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      field_0x8c,lStack_198,lStack_198);
      local_19c = numext::real<float>(x);
      std::abs((int)x);
      pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::coeffRef
                         (&(this->
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
                           .m_singularValues.
                           super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,lStack_198);
      *pSVar4 = extraout_XMM0_Da_01;
      bVar1 = SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::computeU
                        (&this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>);
      if ((bVar1) && (local_19c < 0.0)) {
        DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::col
                  (&local_208,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,lStack_198);
        DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator-
                  (&local_1d8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_208);
        DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::col
                  ((ColXpr *)&i_1,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,lStack_198
                  );
        Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>::operator=
                  ((Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true> *)&i_1,
                   (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                    *)&local_1d8);
      }
    }
    DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_singularValues,&local_60);
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
    m_nonzeroSingularValues =
         (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_diagSize
    ;
    for (pos = 0; pos < (this->
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                        m_diagSize; pos = pos + 1) {
      DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::tail<long>
                (&local_288,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                 &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_singularValues,
                 (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_diagSize - pos);
      local_24c = DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::
                  maxCoeff<long>((DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                                  *)&local_288,&stack0xfffffffffffffdb8);
      if ((local_24c == 0.0) && (!NAN(local_24c))) {
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_nonzeroSingularValues = pos;
        break;
      }
      if (lStack_248 != 0) {
        lStack_248 = pos + lStack_248;
        pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::coeffRef
                           (&(this->
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                             ).m_singularValues.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,pos);
        __b = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::coeffRef
                        (&(this->
                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                          m_singularValues.
                          super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,lStack_248);
        std::swap<float>(pSVar4,__b);
        bVar1 = SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::computeU
                          (&this->
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                          );
        if (bVar1) {
          DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::col
                    (&local_2b8,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,lStack_248);
          DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::col
                    (&local_2e8,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)this,pos);
          DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>::
          swap<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>
                    ((DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>> *)&local_2b8,
                     (DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &local_2e8);
        }
        bVar1 = SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::computeV
                          (&this->
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                          );
        if (bVar1) {
          DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::col
                    (&local_318,
                     (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     &(this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      m_matrixV,lStack_248);
          DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::col
                    (&local_348,
                     (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     &(this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      m_matrixV,pos);
          DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>::
          swap<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>>
                    ((DenseBase<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>> *)&local_318,
                     (DenseBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     &local_348);
        }
      }
    }
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = true;
  }
  else {
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = true;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_info =
         InvalidInput;
  }
  return this;
}

Assistant:

JacobiSVD<MatrixType, QRPreconditioner>&
JacobiSVD<MatrixType, QRPreconditioner>::compute(const MatrixType& matrix, unsigned int computationOptions)
{
  using std::abs;
  allocate(matrix.rows(), matrix.cols(), computationOptions);

  // currently we stop when we reach precision 2*epsilon as the last bit of precision can require an unreasonable number of iterations,
  // only worsening the precision of U and V as we accumulate more rotations
  const RealScalar precision = RealScalar(2) * NumTraits<Scalar>::epsilon();

  // limit for denormal numbers to be considered zero in order to avoid infinite loops (see bug 286)
  const RealScalar considerAsZero = (std::numeric_limits<RealScalar>::min)();

  // Scaling factor to reduce over/under-flows
  RealScalar scale = matrix.cwiseAbs().template maxCoeff<PropagateNaN>();
  if (!(numext::isfinite)(scale)) {
    m_isInitialized = true;
    m_info = InvalidInput;
    return *this;
  }
  if(scale==RealScalar(0)) scale = RealScalar(1);
  
  /*** step 1. The R-SVD step: we use a QR decomposition to reduce to the case of a square matrix */

  if(m_rows!=m_cols)
  {
    m_scaledMatrix = matrix / scale;
    m_qr_precond_morecols.run(*this, m_scaledMatrix);
    m_qr_precond_morerows.run(*this, m_scaledMatrix);
  }
  else
  {
    m_workMatrix = matrix.block(0,0,m_diagSize,m_diagSize) / scale;
    if(m_computeFullU) m_matrixU.setIdentity(m_rows,m_rows);
    if(m_computeThinU) m_matrixU.setIdentity(m_rows,m_diagSize);
    if(m_computeFullV) m_matrixV.setIdentity(m_cols,m_cols);
    if(m_computeThinV) m_matrixV.setIdentity(m_cols, m_diagSize);
  }

  /*** step 2. The main Jacobi SVD iteration. ***/
  RealScalar maxDiagEntry = m_workMatrix.cwiseAbs().diagonal().maxCoeff();

  bool finished = false;
  while(!finished)
  {
    finished = true;

    // do a sweep: for all index pairs (p,q), perform SVD of the corresponding 2x2 sub-matrix

    for(Index p = 1; p < m_diagSize; ++p)
    {
      for(Index q = 0; q < p; ++q)
      {
        // if this 2x2 sub-matrix is not diagonal already...
        // notice that this comparison will evaluate to false if any NaN is involved, ensuring that NaN's don't
        // keep us iterating forever. Similarly, small denormal numbers are considered zero.
        RealScalar threshold = numext::maxi<RealScalar>(considerAsZero, precision * maxDiagEntry);
        if(abs(m_workMatrix.coeff(p,q))>threshold || abs(m_workMatrix.coeff(q,p)) > threshold)
        {
          finished = false;
          // perform SVD decomposition of 2x2 sub-matrix corresponding to indices p,q to make it diagonal
          // the complex to real operation returns true if the updated 2x2 block is not already diagonal
          if(internal::svd_precondition_2x2_block_to_be_real<MatrixType, QRPreconditioner>::run(m_workMatrix, *this, p, q, maxDiagEntry))
          {
            JacobiRotation<RealScalar> j_left, j_right;
            internal::real_2x2_jacobi_svd(m_workMatrix, p, q, &j_left, &j_right);

            // accumulate resulting Jacobi rotations
            m_workMatrix.applyOnTheLeft(p,q,j_left);
            if(computeU()) m_matrixU.applyOnTheRight(p,q,j_left.transpose());

            m_workMatrix.applyOnTheRight(p,q,j_right);
            if(computeV()) m_matrixV.applyOnTheRight(p,q,j_right);

            // keep track of the largest diagonal coefficient
            maxDiagEntry = numext::maxi<RealScalar>(maxDiagEntry,numext::maxi<RealScalar>(abs(m_workMatrix.coeff(p,p)), abs(m_workMatrix.coeff(q,q))));
          }
        }
      }
    }
  }

  /*** step 3. The work matrix is now diagonal, so ensure it's positive so its diagonal entries are the singular values ***/

  for(Index i = 0; i < m_diagSize; ++i)
  {
    // For a complex matrix, some diagonal coefficients might note have been
    // treated by svd_precondition_2x2_block_to_be_real, and the imaginary part
    // of some diagonal entry might not be null.
    if(NumTraits<Scalar>::IsComplex && abs(numext::imag(m_workMatrix.coeff(i,i)))>considerAsZero)
    {
      RealScalar a = abs(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU()) m_matrixU.col(i) *= m_workMatrix.coeff(i,i)/a;
    }
    else
    {
      // m_workMatrix.coeff(i,i) is already real, no difficulty:
      RealScalar a = numext::real(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU() && (a<RealScalar(0))) m_matrixU.col(i) = -m_matrixU.col(i);
    }
  }
  
  m_singularValues *= scale;

  /*** step 4. Sort singular values in descending order and compute the number of nonzero singular values ***/

  m_nonzeroSingularValues = m_diagSize;
  for(Index i = 0; i < m_diagSize; i++)
  {
    Index pos;
    RealScalar maxRemainingSingularValue = m_singularValues.tail(m_diagSize-i).maxCoeff(&pos);
    if(maxRemainingSingularValue == RealScalar(0))
    {
      m_nonzeroSingularValues = i;
      break;
    }
    if(pos)
    {
      pos += i;
      std::swap(m_singularValues.coeffRef(i), m_singularValues.coeffRef(pos));
      if(computeU()) m_matrixU.col(pos).swap(m_matrixU.col(i));
      if(computeV()) m_matrixV.col(pos).swap(m_matrixV.col(i));
    }
  }

  m_isInitialized = true;
  return *this;
}